

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O2

string * __thiscall test_app::str_abi_cxx11_(string *__return_storage_ptr__,test_app *this)

{
  string *psVar1;
  long lVar2;
  string asStack_48 [32];
  
  cppcms::application::response();
  cppcms::http::response::finalize();
  psVar1 = &this->output_;
  lVar2 = std::__cxx11::string::find((char *)psVar1,0x114365);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    this->gzip_ = false;
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)psVar1);
    lVar2 = std::__cxx11::string::find((char *)asStack_48,0x11436a);
    this->gzip_ = lVar2 != -1;
    std::__cxx11::string::~string(asStack_48);
  }
  (this->output_)._M_string_length = 0;
  *(this->output_)._M_dataplus._M_p = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string str()
	{
		response().finalize();
		size_t from = output_.find("\r\n\r\n");
		std::string result;
		if(from==std::string::npos) {
			result = output_;
			gzip_ = false;
		}
		else {
			result = output_.substr(from+4);
			gzip_ = output_.substr(0,from).find("gzip")!=std::string::npos;
		}
		output_.clear();
		return result;
	}